

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sysinfo.cpp
# Opt level: O0

string * embree::stringOfISA_abi_cxx11_(int sse2)

{
  int in_ESI;
  string *in_RDI;
  allocator local_27;
  allocator local_26;
  allocator local_25;
  allocator local_24;
  allocator local_23;
  allocator local_22;
  allocator local_21;
  allocator local_20;
  allocator local_1f;
  allocator local_1e;
  allocator local_1d [16];
  allocator local_d [13];
  
  if (in_ESI == 0x2000001) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"SSE",local_d);
    std::allocator<char>::~allocator((allocator<char> *)local_d);
  }
  else if (in_ESI == 0x2000003) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"SSE2",local_1d);
    std::allocator<char>::~allocator((allocator<char> *)local_1d);
  }
  else if (in_ESI == 0x2000007) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"SSE3",&local_1e);
    std::allocator<char>::~allocator((allocator<char> *)&local_1e);
  }
  else if (in_ESI == 0x200000f) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"SSSE3",&local_1f);
    std::allocator<char>::~allocator((allocator<char> *)&local_1f);
  }
  else if (in_ESI == 0x200001f) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"SSE4.1",&local_20);
    std::allocator<char>::~allocator((allocator<char> *)&local_20);
  }
  else if (in_ESI == 0x200007f) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"SSE4.2",&local_21);
    std::allocator<char>::~allocator((allocator<char> *)&local_21);
  }
  else if (in_ESI == 0x60000ff) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"AVX",&local_22);
    std::allocator<char>::~allocator((allocator<char> *)&local_22);
  }
  else if (in_ESI == 0x6007dff) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"AVX2",&local_23);
    std::allocator<char>::~allocator((allocator<char> *)&local_23);
  }
  else if (in_ESI == 0xe737dff) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"AVX512",&local_24);
    std::allocator<char>::~allocator((allocator<char> *)&local_24);
  }
  else if (in_ESI == 0x10000003) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"NEON",&local_25);
    std::allocator<char>::~allocator((allocator<char> *)&local_25);
  }
  else if (in_ESI == 0x26007dff) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"2xNEON",&local_26);
    std::allocator<char>::~allocator((allocator<char> *)&local_26);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"UNKNOWN",&local_27);
    std::allocator<char>::~allocator((allocator<char> *)&local_27);
  }
  return in_RDI;
}

Assistant:

std::string stringOfISA (int isa)
  {
    if (isa == SSE) return "SSE";
    if (isa == SSE2) return "SSE2";
    if (isa == SSE3) return "SSE3";
    if (isa == SSSE3) return "SSSE3";
    if (isa == SSE41) return "SSE4.1";
    if (isa == SSE42) return "SSE4.2";
    if (isa == AVX) return "AVX";
    if (isa == AVX2) return "AVX2";
    if (isa == AVX512) return "AVX512";

    if (isa == NEON) return "NEON";
    if (isa == NEON_2X) return "2xNEON";
    return "UNKNOWN";
  }